

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flasher.cpp
# Opt level: O0

void __thiscall Flasher::info(Flasher *this,FlasherInfo *info)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  int iVar4;
  pointer pFVar5;
  string *psVar6;
  vector<bool,_std::allocator<bool>_> local_60;
  string local_38;
  FlasherInfo *local_18;
  FlasherInfo *info_local;
  Flasher *this_local;
  
  local_18 = info;
  info_local = (FlasherInfo *)this;
  pFVar5 = std::unique_ptr<Flash,_std::default_delete<Flash>_>::operator->(this->_flash);
  psVar6 = Flash::name_abi_cxx11_(pFVar5);
  std::__cxx11::string::operator=((string *)&local_18->name,(string *)psVar6);
  Samba::version_abi_cxx11_(&local_38,this->_samba);
  std::__cxx11::string::operator=((string *)&local_18->version,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  pFVar5 = std::unique_ptr<Flash,_std::default_delete<Flash>_>::operator->(this->_flash);
  uVar2 = (*pFVar5->_vptr_Flash[2])();
  local_18->address = uVar2;
  pFVar5 = std::unique_ptr<Flash,_std::default_delete<Flash>_>::operator->(this->_flash);
  uVar2 = (*pFVar5->_vptr_Flash[4])();
  local_18->numPages = uVar2;
  pFVar5 = std::unique_ptr<Flash,_std::default_delete<Flash>_>::operator->(this->_flash);
  uVar2 = (*pFVar5->_vptr_Flash[3])();
  local_18->pageSize = uVar2;
  pFVar5 = std::unique_ptr<Flash,_std::default_delete<Flash>_>::operator->(this->_flash);
  iVar3 = (*pFVar5->_vptr_Flash[4])();
  pFVar5 = std::unique_ptr<Flash,_std::default_delete<Flash>_>::operator->(this->_flash);
  iVar4 = (*pFVar5->_vptr_Flash[3])();
  local_18->totalSize = iVar3 * iVar4;
  pFVar5 = std::unique_ptr<Flash,_std::default_delete<Flash>_>::operator->(this->_flash);
  uVar2 = (*pFVar5->_vptr_Flash[5])();
  local_18->numPlanes = uVar2;
  pFVar5 = std::unique_ptr<Flash,_std::default_delete<Flash>_>::operator->(this->_flash);
  iVar3 = (*pFVar5->_vptr_Flash[0xc])();
  local_18->security = (bool)((byte)iVar3 & 1);
  pFVar5 = std::unique_ptr<Flash,_std::default_delete<Flash>_>::operator->(this->_flash);
  iVar3 = (*pFVar5->_vptr_Flash[0x14])();
  local_18->bootFlash = (bool)((byte)iVar3 & 1);
  pFVar5 = std::unique_ptr<Flash,_std::default_delete<Flash>_>::operator->(this->_flash);
  iVar3 = (*pFVar5->_vptr_Flash[0xe])();
  local_18->bod = (bool)((byte)iVar3 & 1);
  pFVar5 = std::unique_ptr<Flash,_std::default_delete<Flash>_>::operator->(this->_flash);
  iVar3 = (*pFVar5->_vptr_Flash[0x11])();
  local_18->bor = (bool)((byte)iVar3 & 1);
  pFVar5 = std::unique_ptr<Flash,_std::default_delete<Flash>_>::operator->(this->_flash);
  iVar3 = (*pFVar5->_vptr_Flash[0x16])();
  local_18->canBootFlash = (bool)((byte)iVar3 & 1);
  pFVar5 = std::unique_ptr<Flash,_std::default_delete<Flash>_>::operator->(this->_flash);
  iVar3 = (*pFVar5->_vptr_Flash[0x10])();
  local_18->canBod = (bool)((byte)iVar3 & 1);
  pFVar5 = std::unique_ptr<Flash,_std::default_delete<Flash>_>::operator->(this->_flash);
  iVar3 = (*pFVar5->_vptr_Flash[0x13])();
  local_18->canBor = (bool)((byte)iVar3 & 1);
  bVar1 = Samba::canChipErase(this->_samba);
  local_18->canChipErase = bVar1;
  bVar1 = Samba::canWriteBuffer(this->_samba);
  local_18->canWriteBuffer = bVar1;
  bVar1 = Samba::canChecksumBuffer(this->_samba);
  local_18->canChecksumBuffer = bVar1;
  pFVar5 = std::unique_ptr<Flash,_std::default_delete<Flash>_>::operator->(this->_flash);
  (*pFVar5->_vptr_Flash[10])(&local_60);
  std::vector<bool,_std::allocator<bool>_>::operator=(&local_18->lockRegions,&local_60);
  std::vector<bool,_std::allocator<bool>_>::~vector(&local_60);
  return;
}

Assistant:

void
Flasher::info(FlasherInfo& info)
{
    info.name = _flash->name();
    info.version = _samba.version();
    info.address = _flash->address();
    info.numPages = _flash->numPages();
    info.pageSize = _flash->pageSize();
    info.totalSize = _flash->numPages() * _flash->pageSize();
    info.numPlanes = _flash->numPlanes();
    info.security = _flash->getSecurity();
    info.bootFlash = _flash->getBootFlash();
    info.bod = _flash->getBod();
    info.bor = _flash->getBor();

    info.canBootFlash = _flash->canBootFlash();
    info.canBod = _flash->canBod();
    info.canBor = _flash->canBor();
    info.canChipErase = _samba.canChipErase();
    info.canWriteBuffer = _samba.canWriteBuffer();
    info.canChecksumBuffer = _samba.canChecksumBuffer();
    info.lockRegions = _flash->getLockRegions();
}